

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O3

int SPAKE2_generate_msg(SPAKE2_CTX *ctx,uint8_t *out,size_t *out_len,size_t max_out_len,
                       uint8_t *password,size_t password_len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  uint8_t *precomp_table;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  scalar password_scalar;
  uint8_t private_tmp [64];
  uint8_t password_tmp [64];
  ge_cached mask_cached;
  ge_p3 mask;
  ge_p3 P;
  ge_p2 Pstar_proj;
  ge_p1p1 Pstar;
  ulong local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  ulong local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  ge_cached local_328;
  ge_p3 local_288;
  ge_p3 local_1e8;
  ge_p2 local_148;
  ge_p1p1 local_d0;
  
  iVar4 = 0;
  if ((0x1f < max_out_len) && (iVar4 = 0, ctx->state == spake2_state_init)) {
    RAND_bytes((uchar *)&local_3a8,0x40);
    x25519_sc_reduce((uint8_t *)&local_3a8);
    lVar5 = 0;
    auVar6 = (undefined1  [16])0x0;
    do {
      auVar7 = *(undefined1 (*) [16])((long)&local_3a8 + lVar5);
      auVar8._0_2_ = auVar7._0_2_ >> 5;
      auVar8._2_2_ = auVar7._2_2_ >> 5;
      auVar8._4_2_ = auVar7._4_2_ >> 5;
      auVar8._6_2_ = auVar7._6_2_ >> 5;
      auVar8._8_2_ = auVar7._8_2_ >> 5;
      auVar8._10_2_ = auVar7._10_2_ >> 5;
      auVar8._12_2_ = auVar7._12_2_ >> 5;
      auVar8._14_2_ = auVar7._14_2_ >> 5;
      auVar8 = auVar8 & _DAT_00258640;
      auVar7 = psllw(auVar7,3);
      auVar9._0_8_ = auVar8._0_8_ << 8;
      auVar9._8_8_ = auVar8._8_8_ << 8 | auVar8._0_8_ >> 0x38;
      *(undefined1 (*) [16])((long)&local_3a8 + lVar5) =
           auVar7 & _DAT_00258650 | auVar6 >> 0x78 | auVar9;
      lVar5 = lVar5 + 0x10;
      auVar6 = auVar8;
    } while (lVar5 != 0x20);
    *(undefined8 *)(ctx->private_key + 0x10) = local_398;
    *(undefined8 *)(ctx->private_key + 0x18) = uStack_390;
    *(undefined8 *)ctx->private_key = local_3a8;
    *(undefined8 *)(ctx->private_key + 8) = uStack_3a0;
    x25519_ge_scalarmult_base(&local_1e8,ctx->private_key);
    SHA512(password,password_len,(uchar *)&local_368);
    *(ulong *)ctx->password_hash = local_368;
    *(undefined8 *)(ctx->password_hash + 8) = uStack_360;
    *(undefined8 *)(ctx->password_hash + 0x10) = local_358;
    *(undefined8 *)(ctx->password_hash + 0x18) = uStack_350;
    *(undefined8 *)(ctx->password_hash + 0x20) = local_348;
    *(undefined8 *)(ctx->password_hash + 0x28) = uStack_340;
    *(undefined8 *)(ctx->password_hash + 0x30) = local_338;
    *(undefined8 *)(ctx->password_hash + 0x38) = uStack_330;
    x25519_sc_reduce((uint8_t *)&local_368);
    local_3b8 = local_358;
    uStack_3b0 = uStack_350;
    local_3c8 = local_368;
    uStack_3c0 = uStack_360;
    if (ctx->disable_password_scalar_hack == '\0') {
      local_288.X.v[2] = 0;
      local_288.X.v[3] = 0x1000000000000000;
      local_288.X.v[0] = 0x5812631a5cf5d3ed;
      local_288.X.v[1] = 0x14def9dea2f79cd6;
      local_328.YplusX.v[2] = 0;
      local_328.YplusX.v[3] = 0;
      local_328.YplusX.v[0] = 0;
      local_328.YplusX.v[1] = 0;
      bn_select_words((BN_ULONG *)&local_328,-(ulong)((uint)local_368 & 1),(BN_ULONG *)&local_288,
                      (BN_ULONG *)&local_328,4);
      bn_add_words(&local_3c8,&local_3c8,(ulong *)&local_328,4);
      bn_add_words((ulong *)&local_288,(ulong *)&local_288,(ulong *)&local_288,4);
      local_328.YplusX.v[0] = 0;
      local_328.YplusX.v[1] = 0;
      local_328.YplusX.v[2] = 0;
      local_328.YplusX.v[3] = 0;
      bn_select_words((BN_ULONG *)&local_328,(long)((ulong)(~(uint)local_3c8 & 2) - 1) >> 0x3f,
                      (BN_ULONG *)&local_288,(BN_ULONG *)&local_328,4);
      bn_add_words(&local_3c8,&local_3c8,(ulong *)&local_328,4);
      bn_add_words((ulong *)&local_288,(ulong *)&local_288,(ulong *)&local_288,4);
      local_328.YplusX.v[0] = 0;
      local_328.YplusX.v[1] = 0;
      local_328.YplusX.v[2] = 0;
      local_328.YplusX.v[3] = 0;
      bn_select_words((BN_ULONG *)&local_328,(long)((ulong)(~(uint)local_3c8 & 4) - 1) >> 0x3f,
                      (BN_ULONG *)&local_288,(BN_ULONG *)&local_328,4);
      bn_add_words(&local_3c8,&local_3c8,(ulong *)&local_328,4);
      if ((local_3c8 & 7) != 0) {
        __assert_fail("(password_scalar.words[0] & 7) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/spake25519.cc"
                      ,0x1a5,
                      "int SPAKE2_generate_msg(SPAKE2_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t)"
                     );
      }
    }
    *(undefined8 *)(ctx->password_scalar + 0x10) = local_3b8;
    *(undefined8 *)(ctx->password_scalar + 0x18) = uStack_3b0;
    *(ulong *)ctx->password_scalar = local_3c8;
    *(undefined8 *)(ctx->password_scalar + 8) = uStack_3c0;
    precomp_table = kSpakeNSmallPrecomp;
    if (ctx->my_role == spake2_role_alice) {
      precomp_table = kSpakeMSmallPrecomp;
    }
    x25519_ge_scalarmult_small_precomp(&local_288,ctx->password_scalar,precomp_table);
    x25519_ge_p3_to_cached(&local_328,&local_288);
    x25519_ge_add(&local_d0,&local_1e8,&local_328);
    x25519_ge_p1p1_to_p2(&local_148,&local_d0);
    x25519_ge_tobytes(ctx->my_msg,&local_148);
    uVar1 = *(undefined8 *)ctx->my_msg;
    uVar2 = *(undefined8 *)(ctx->my_msg + 8);
    uVar3 = *(undefined8 *)(ctx->my_msg + 0x18);
    *(undefined8 *)(out + 0x10) = *(undefined8 *)(ctx->my_msg + 0x10);
    *(undefined8 *)(out + 0x18) = uVar3;
    *(undefined8 *)out = uVar1;
    *(undefined8 *)(out + 8) = uVar2;
    *out_len = 0x20;
    ctx->state = spake2_state_msg_generated;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int SPAKE2_generate_msg(SPAKE2_CTX *ctx, uint8_t *out, size_t *out_len,
                        size_t max_out_len, const uint8_t *password,
                        size_t password_len) {
  if (ctx->state != spake2_state_init) {
    return 0;
  }

  if (max_out_len < sizeof(ctx->my_msg)) {
    return 0;
  }

  uint8_t private_tmp[64];
  RAND_bytes(private_tmp, sizeof(private_tmp));
  x25519_sc_reduce(private_tmp);
  // Multiply by the cofactor (eight) so that we'll clear it when operating on
  // the peer's point later in the protocol.
  left_shift_3(private_tmp);
  OPENSSL_memcpy(ctx->private_key, private_tmp, sizeof(ctx->private_key));

  ge_p3 P;
  x25519_ge_scalarmult_base(&P, ctx->private_key);

  // mask = h(password) * <N or M>.
  uint8_t password_tmp[SHA512_DIGEST_LENGTH];
  SHA512(password, password_len, password_tmp);
  OPENSSL_memcpy(ctx->password_hash, password_tmp, sizeof(ctx->password_hash));
  x25519_sc_reduce(password_tmp);

  // Due to a copy-paste error, the call to |left_shift_3| was omitted after
  // the |x25519_sc_reduce|, just above. This meant that |ctx->password_scalar|
  // was not a multiple of eight to clear the cofactor and thus three bits of
  // the password hash would leak. In order to fix this in a unilateral way,
  // points of small order are added to the mask point such that it is in the
  // prime-order subgroup. Since the ephemeral scalar is a multiple of eight,
  // these points will cancel out when calculating the shared secret.
  //
  // Adding points of small order is the same as adding multiples of the prime
  // order to the password scalar. Since that's faster, that is what is done
  // below. The prime order (kOrder) is a large prime, thus odd, thus the LSB
  // is one. So adding it will flip the LSB. Adding twice it will flip the next
  // bit and so one for all the bottom three bits.

  scalar password_scalar;
  OPENSSL_memcpy(&password_scalar, password_tmp, sizeof(password_scalar));

  // |password_scalar| is the result of |x25519_sc_reduce| and thus is, at
  // most, $l-1$ (where $l$ is |kOrder|, the order of the prime-order subgroup
  // of Ed25519). In the following, we may add $l + 2×l + 4×l$ for a max value
  // of $8×l-1$. That is < 2**256, as required.

  if (!ctx->disable_password_scalar_hack) {
    scalar order = kOrder;
    scalar tmp;

    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 1, 1));
    scalar_add(&password_scalar, &tmp);

    scalar_double(&order);
    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 2, 2));
    scalar_add(&password_scalar, &tmp);

    scalar_double(&order);
    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 4, 4));
    scalar_add(&password_scalar, &tmp);

    assert((password_scalar.words[0] & 7) == 0);
  }

  OPENSSL_memcpy(ctx->password_scalar, password_scalar.words,
                 sizeof(ctx->password_scalar));

  ge_p3 mask;
  x25519_ge_scalarmult_small_precomp(&mask, ctx->password_scalar,
                                     ctx->my_role == spake2_role_alice
                                         ? kSpakeMSmallPrecomp
                                         : kSpakeNSmallPrecomp);

  // P* = P + mask.
  ge_cached mask_cached;
  x25519_ge_p3_to_cached(&mask_cached, &mask);
  ge_p1p1 Pstar;
  x25519_ge_add(&Pstar, &P, &mask_cached);

  // Encode P*
  ge_p2 Pstar_proj;
  x25519_ge_p1p1_to_p2(&Pstar_proj, &Pstar);
  x25519_ge_tobytes(ctx->my_msg, &Pstar_proj);

  OPENSSL_memcpy(out, ctx->my_msg, sizeof(ctx->my_msg));
  *out_len = sizeof(ctx->my_msg);
  ctx->state = spake2_state_msg_generated;

  return 1;
}